

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

Result<void> * __thiscall
wallet::CWallet::RemoveTxs
          (Result<void> *__return_storage_ptr__,CWallet *this,
          vector<uint256,_std::allocator<uint256>_> *txs_to_remove)

{
  undefined8 *puVar1;
  WalletDatabase *pWVar2;
  pointer puVar3;
  __node_type *p_Var4;
  long *plVar5;
  long lVar6;
  iterator iVar7;
  bool bVar8;
  size_type *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  __index_type _Var10;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *it;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *p_Var11;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> __it;
  pointer __k;
  CTxIn *txin;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long in_FS_OFFSET;
  iterator it_wtx;
  vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  erased_txs;
  uint256 hash;
  bilingual_str str_err;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_230;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *local_228;
  iterator iStack_220;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *local_218;
  WalletBatch local_208;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  undefined8 uStack_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  bilingual_str local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar2 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_208,pWVar2,1);
  local_208.m_database = pWVar2;
  bVar8 = WalletBatch::TxnBegin(&local_208);
  if (!bVar8) {
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Error starting db txn for wallet transactions removal","");
    paVar13 = &local_58.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_58._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Error starting db txn for wallet transactions removal","");
    }
    else {
      local_b8._M_dataplus._M_p = "Error starting db txn for wallet transactions removal";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_b8);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if ((undefined1 *)local_78._M_allocated_capacity == &local_68) {
      *puVar1 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x18) = uStack_60;
    }
    else {
      *(size_type *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_78._M_allocated_capacity
      ;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10) =
           CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8) = local_78._8_8_;
    local_78._8_8_ = 0;
    local_68 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar13) {
      *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                         local_58.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x38) =
           local_58.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) =
           local_58._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30) =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x28) =
         local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\0';
    local_78._M_allocated_capacity = (size_type)&local_68;
    local_58._M_dataplus._M_p = (pointer)paVar13;
    goto LAB_00533907;
  }
  local_228 = (_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)0x0;
  iStack_220._M_current =
       (_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)0x0;
  local_218 = (_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10);
  local_98._8_8_ = 0;
  local_98[0x10] = '\0';
  __k = (txs_to_remove->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar3 = (txs_to_remove->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_98._0_8_ = args;
  if (__k != puVar3) {
    do {
      local_230._M_cur =
           (__node_type *)
           _GLOBAL__N_1::std::
           _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&this->mapWallet,__k);
      if (local_230._M_cur == (__node_type *)0x0) {
        local_138._M_p = (pointer)&local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Transaction %s does not belong to this wallet","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"Transaction %s does not belong to this wallet","");
        }
        else {
          local_158._0_8_ = "Transaction %s does not belong to this wallet";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_158);
        }
        base_blob<256u>::GetHex_abi_cxx11_((string *)local_158,__k);
        tinyformat::format<std::__cxx11::string>
                  (&local_f8,(tinyformat *)&local_138,(bilingual_str *)local_158,args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_b8,&local_f8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_f8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
          operator_delete(local_f8.translated._M_dataplus._M_p,
                          local_f8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
          operator_delete(local_f8.original._M_dataplus._M_p,
                          local_f8.original.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_00533aef:
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
LAB_00533aff:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != &local_128) {
          operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
        }
        break;
      }
      local_178 = *(undefined8 *)(__k->super_base_blob<256U>).m_data._M_elems;
      uStack_170 = *(undefined8 *)((__k->super_base_blob<256U>).m_data._M_elems + 8);
      local_168 = *(undefined8 *)((__k->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_160 = *(undefined8 *)((__k->super_base_blob<256U>).m_data._M_elems + 0x18);
      bVar8 = WalletBatch::EraseTx
                        (&local_208,
                         (base_blob<256U>)
                         *(base_blob<256U> *)(__k->super_base_blob<256U>).m_data._M_elems);
      if (!bVar8) {
        local_138._M_p = (pointer)&local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Failure removing transaction: %s","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"Failure removing transaction: %s","");
        }
        else {
          local_158._0_8_ = "Failure removing transaction: %s";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_158);
        }
        base_blob<256u>::GetHex_abi_cxx11_((string *)local_158,__k);
        tinyformat::format<std::__cxx11::string>
                  (&local_f8,(tinyformat *)&local_138,(bilingual_str *)local_158,args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_b8,&local_f8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_f8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) {
          operator_delete(local_f8.translated._M_dataplus._M_p,
                          local_f8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
          operator_delete(local_f8.original._M_dataplus._M_p,
                          local_f8.original.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_00533aef;
        goto LAB_00533aff;
      }
      if (iStack_220._M_current == local_218) {
        std::
        vector<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>,std::allocator<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>>>
        ::
        _M_realloc_insert<std::__detail::_Node_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>&>
                  ((vector<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>,std::allocator<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>>>
                    *)&local_228,iStack_220,
                   (_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                   &local_230);
      }
      else {
        ((iStack_220._M_current)->
        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>)._M_cur =
             (__node_type *)local_230._M_cur;
        iStack_220._M_current = iStack_220._M_current + 1;
      }
      __k = __k + 1;
    } while (__k != puVar3);
  }
  if (local_b8._M_string_length == 0) {
    bVar8 = WalletBatch::TxnCommit(&local_208);
    iVar7._M_current =
         (_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
         iStack_220;
    if (!bVar8) {
      local_1f8 = &local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"Error committing db txn for wallet transactions removal","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"Error committing db txn for wallet transactions removal",""
                  );
      }
      else {
        local_f8.original._M_dataplus._M_p =
             "Error committing db txn for wallet transactions removal";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_1d8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_f8);
      }
      paVar13 = &local_1d8.field_2;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
      if (local_1f8 == &local_1e8) {
        *puVar1 = CONCAT71(uStack_1e7,local_1e8);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x18) =
             uStack_1e0;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = local_1f8;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10) =
             CONCAT71(uStack_1e7,local_1e8);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8) = local_1f0;
      local_1f0 = 0;
      local_1e8 = 0;
      psVar9 = (size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
      *(size_type **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) = psVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == paVar13) {
        *psVar9 = local_1d8.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x38) =
             local_1d8.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) =
             local_1d8._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30) =
             local_1d8.field_2._M_allocated_capacity;
      }
      psVar9 = &local_1d8._M_string_length;
      local_1f8 = &local_1e8;
      goto LAB_00533885;
    }
    if (local_228 != iStack_220._M_current) {
      p_Var11 = local_228;
      do {
        p_Var4 = (p_Var11->
                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                 _M_cur;
        local_f8.original._M_dataplus._M_p =
             *(pointer *)
              &(p_Var4->super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
               super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
               _M_storage.__align;
        local_f8.original._M_string_length =
             *(size_type *)
              ((long)&(p_Var4->
                      super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                      super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                      _M_storage._M_storage + 8);
        local_f8.original.field_2._M_allocated_capacity =
             *(size_type *)
              ((long)&(p_Var4->
                      super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                      super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                      _M_storage._M_storage + 0x10);
        local_f8.original.field_2._8_8_ =
             *(undefined8 *)
              ((long)&(p_Var4->
                      super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                      super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                      _M_storage._M_storage + 0x18);
        std::
        _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                            *)&this->wtxOrdered,
                           *(_Base_ptr *)
                            ((long)&(((p_Var11->
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      )._M_cur)->
                                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                    ._M_storage._M_storage + 0x80));
        __it._M_cur = (p_Var11->
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                      _M_cur;
        plVar5 = *(long **)((long)&((__it._M_cur)->
                                   super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                   ._M_storage._M_storage + 0x1b8);
        lVar12 = *plVar5;
        lVar6 = plVar5[1];
        if (lVar12 != lVar6) {
          do {
            std::
            _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::_M_erase(&(this->mapTxSpends)._M_h,lVar12);
            lVar12 = lVar12 + 0x68;
          } while (lVar12 != lVar6);
          __it._M_cur = (p_Var11->
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        )._M_cur;
        }
        std::
        _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::erase(&(this->mapWallet)._M_h,(const_iterator)__it._M_cur);
        boost::signals2::
        signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
        ::operator()(&this->NotifyTransactionChanged,(uint256 *)&local_f8,CT_DELETED);
        p_Var11 = p_Var11 + 1;
      } while (p_Var11 != iVar7._M_current);
    }
    _Var10 = '\x01';
    MarkDirty(this);
  }
  else {
    WalletBatch::TxnAbort(&local_208);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    paVar13 = &local_188;
    local_198 = paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_98._0_8_,(pointer)(local_98._0_8_ + local_98._8_8_));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_1b8 == &local_1a8) {
      *puVar1 = CONCAT71(uStack_1a7,local_1a8);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x18) = uStack_1a0
      ;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_1b8;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10) =
           CONCAT71(uStack_1a7,local_1a8);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8) = local_1b0;
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8 = 0;
    psVar9 = (size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
    *(size_type **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) = psVar9;
    if (local_198 == paVar13) {
      *psVar9 = local_188._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x38) =
           local_188._8_8_;
    }
    else {
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) =
           local_198;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30) =
           local_188._M_allocated_capacity;
    }
    psVar9 = &local_190;
LAB_00533885:
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x28) = *psVar9;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar9 + -1))->
    _M_dataplus)._M_p = (pointer)paVar13;
    *psVar9 = 0;
    paVar13->_M_local_buf[0] = '\0';
    _Var10 = '\0';
  }
  (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = _Var10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_228 !=
      (_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)0x0) {
    operator_delete(local_228,(long)local_218 - (long)local_228);
  }
LAB_00533907:
  if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_208.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl != (DatabaseBatch *)0x0) {
    (*(*(_func_int ***)
        local_208.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> CWallet::RemoveTxs(std::vector<uint256>& txs_to_remove)
{
    AssertLockHeld(cs_wallet);
    WalletBatch batch(GetDatabase());
    if (!batch.TxnBegin()) return util::Error{_("Error starting db txn for wallet transactions removal")};

    // Check for transaction existence and remove entries from disk
    using TxIterator = std::unordered_map<uint256, CWalletTx, SaltedTxidHasher>::const_iterator;
    std::vector<TxIterator> erased_txs;
    bilingual_str str_err;
    for (const uint256& hash : txs_to_remove) {
        auto it_wtx = mapWallet.find(hash);
        if (it_wtx == mapWallet.end()) {
            str_err = strprintf(_("Transaction %s does not belong to this wallet"), hash.GetHex());
            break;
        }
        if (!batch.EraseTx(hash)) {
            str_err = strprintf(_("Failure removing transaction: %s"), hash.GetHex());
            break;
        }
        erased_txs.emplace_back(it_wtx);
    }

    // Roll back removals in case of an error
    if (!str_err.empty()) {
        batch.TxnAbort();
        return util::Error{str_err};
    }

    // Dump changes to disk
    if (!batch.TxnCommit()) return util::Error{_("Error committing db txn for wallet transactions removal")};

    // Update the in-memory state and notify upper layers about the removals
    for (const auto& it : erased_txs) {
        const uint256 hash{it->first};
        wtxOrdered.erase(it->second.m_it_wtxOrdered);
        for (const auto& txin : it->second.tx->vin)
            mapTxSpends.erase(txin.prevout);
        mapWallet.erase(it);
        NotifyTransactionChanged(hash, CT_DELETED);
    }

    MarkDirty();

    return {}; // all good
}